

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall
lts2::LBDOperator::drawBasis
          (LBDOperator *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *basisFunctions,int normalize
          )

{
  reference pvVar1;
  _InputArray *p_Var2;
  _InputOutputArray local_128;
  _InputArray local_110;
  _OutputArray local_f8;
  _InputArray local_e0;
  _OutputArray local_c8;
  _InputArray local_b0;
  uint local_84;
  Mat local_80 [4];
  int i;
  Mat negPart;
  int normalize_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *basisFunctions_local;
  LBDOperator *this_local;
  
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
            (basisFunctions,(ulong)*(uint *)&(this->super_LinearOperator).field_0xc);
  cv::Mat::Mat(local_80);
  for (local_84 = 0; local_84 < *(uint *)&(this->super_LinearOperator).field_0xc;
      local_84 = local_84 + 1) {
    pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                       (basisFunctions,(long)(int)local_84);
    fillBasisFunctionForIndex(this,pvVar1,local_84);
    if (0 < normalize) {
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::_InputArray::_InputArray(&local_b0,pvVar1);
      cv::_OutputArray::_OutputArray(&local_c8,local_80);
      cv::threshold(&local_b0,&local_c8,-1.1754943508222875e-38,-1.0,1);
      cv::_OutputArray::~_OutputArray(&local_c8);
      cv::_InputArray::~_InputArray(&local_b0);
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::_InputArray::_InputArray(&local_e0,pvVar1);
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::_OutputArray::_OutputArray(&local_f8,pvVar1);
      cv::threshold(&local_e0,&local_f8,1.1754943508222875e-38,1.0,0);
      cv::_OutputArray::~_OutputArray(&local_f8);
      cv::_InputArray::~_InputArray(&local_e0);
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::operator+=(pvVar1,local_80);
    }
    if (normalize != 0) {
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::_InputArray::_InputArray(&local_110,pvVar1);
      pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (basisFunctions,(long)(int)local_84);
      cv::_InputOutputArray::_InputOutputArray(&local_128,pvVar1);
      p_Var2 = (_InputArray *)cv::noArray();
      cv::normalize(&local_110,&local_128,0.0,1.0,0x20,-1,p_Var2);
      cv::_InputOutputArray::~_InputOutputArray(&local_128);
      cv::_InputArray::~_InputArray(&local_110);
    }
  }
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void lts2::LBDOperator::drawBasis(std::vector<cv::Mat> &basisFunctions, int normalize) const
{
  basisFunctions.resize(_pairsInUse);
  cv::Mat negPart;

  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(basisFunctions[i], i);

    if (normalize > 0) {
      cv::threshold(basisFunctions[i], negPart, -FLT_MIN, -1.0, cv::THRESH_BINARY_INV);
      cv::threshold(basisFunctions[i], basisFunctions[i], FLT_MIN, 1.0, cv::THRESH_BINARY);
      basisFunctions[i] += negPart;
    }
    if (normalize != 0) cv::normalize(basisFunctions[i], basisFunctions[i], 0.0, 1.0, cv::NORM_MINMAX);
  }
}